

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

ostream * Eigen::operator<<(ostream *s,
                           DenseBase<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                           *m)

{
  ostream *poVar1;
  allocator local_1de;
  allocator local_1dd;
  allocator local_1dc;
  allocator local_1db;
  allocator local_1da;
  allocator local_1d9;
  Array<double,__1,_1,_0,__1,_1> local_1d8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  IOFormat local_108;
  
  Array<double,-1,1,0,-1,1>::
  Array<Eigen::ArrayWrapper<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            ((Array<double,_1,1,0,_1,1> *)&local_1d8,
             (ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)m);
  std::__cxx11::string::string((string *)&local_188," ",&local_1d9);
  std::__cxx11::string::string((string *)&local_1a8,"\n",&local_1da);
  std::__cxx11::string::string((string *)&local_1c8,"",&local_1db);
  std::__cxx11::string::string((string *)&local_128,"",&local_1dc);
  std::__cxx11::string::string((string *)&local_148,"",&local_1dd);
  std::__cxx11::string::string((string *)&local_168,"",&local_1de);
  IOFormat::IOFormat(&local_108,-1,0,&local_188,&local_1a8,&local_1c8,&local_128,&local_148,
                     &local_168);
  poVar1 = internal::print_matrix<Eigen::Array<double,_1,1,0,_1,1>>(s,&local_1d8,&local_108);
  IOFormat::~IOFormat(&local_108);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  free(local_1d8.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return poVar1;
}

Assistant:

std::ostream & operator <<
(std::ostream & s,
 const DenseBase<Derived> & m)
{
  return internal::print_matrix(s, m.eval(), EIGEN_DEFAULT_IO_FORMAT);
}